

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::comando_sem_rotulo(Sintatico *this)

{
  bool bVar1;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Sintatico *local_10;
  Sintatico *this_local;
  
  local_10 = this;
  switch(this->tok) {
  default:
    saltBlank(this);
    break;
  case 0x1f:
    condicional(this);
    break;
  case 0x21:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"then",&local_31);
    error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  case 0x29:
    repetitivo(this);
    break;
  case 0x22:
    composto(this);
    break;
  case 0x2a:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"while",&local_69);
    error(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  case 2:
    identificador(this);
    bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x1b);
    if (bVar1) {
      atribuicao(this);
    }
    else {
      chamada_de_procedimento(this);
    }
  }
  return;
}

Assistant:

void Sintatico::comando_sem_rotulo() {
  switch (tok) {
    case BEGIN: composto(); break;
    case IF   : condicional(); break;
    case ELSE : error("then");
    case WHILE: repetitivo(); break;
    case DO : error("while");
    case LETRA:
      identificador();
      if (isEqual(tok, DOISPONTOSIGUAL))
        atribuicao();
      else chamada_de_procedimento();
      break;
    default: saltBlank();
  }
}